

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.hh
# Opt level: O3

int4 __thiscall Varnode::isConstantExtended(Varnode *this,uintb *val)

{
  OpCode OVar1;
  PcodeOp *pPVar2;
  int4 iVar3;
  
  iVar3 = 0;
  if ((this->flags & 2) == 0) {
    if ((this->flags & 0x10) == 0) {
      return -1;
    }
    pPVar2 = this->def;
    OVar1 = pPVar2->opcode->opcode;
    if (OVar1 == CPUI_INT_SEXT) {
      this = *(pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      iVar3 = 2;
    }
    else {
      if (OVar1 != CPUI_INT_ZEXT) {
        return -1;
      }
      this = *(pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      iVar3 = 1;
    }
    if ((this->flags & 2) == 0) {
      return -1;
    }
  }
  *val = (this->loc).offset;
  return iVar3;
}

Assistant:

bool isInput(void) const { return ((flags&Varnode::input)!=0); }